

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

bool slang::syntax::SyntaxFacts::isEndOfTransSet(TokenKind kind)

{
  bool bVar1;
  undefined2 in_register_0000003a;
  
  bVar1 = true;
  if (((1 < CONCAT22(in_register_0000003a,kind) - 0x12U) &&
      (1 < CONCAT22(in_register_0000003a,kind) - 0xb9U)) &&
     (CONCAT22(in_register_0000003a,kind) != 0x6b)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SyntaxFacts::isEndOfTransSet(TokenKind kind) {
    switch (kind) {
        case TokenKind::Semicolon:
        case TokenKind::CloseParenthesis:
        case TokenKind::BinsKeyword:
        case TokenKind::IllegalBinsKeyword:
        case TokenKind::IgnoreBinsKeyword:
            return true;
        default:
            return false;
    }
}